

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

int GeneratePartition0(VP8Encoder *enc)

{
  int iVar1;
  VP8BitWriter *bw_00;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long in_RDI;
  uint64_t pos3;
  uint64_t pos2;
  uint64_t pos1;
  int mb_size;
  VP8BitWriter *bw;
  VP8Encoder *in_stack_00000f00;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint32_t value;
  VP8BitWriter *in_stack_ffffffffffffffc0;
  VP8BitWriter *bw_01;
  VP8Encoder *in_stack_ffffffffffffffc8;
  VP8BitWriter *in_stack_ffffffffffffffd0;
  int local_4;
  
  bw_00 = (VP8BitWriter *)(in_RDI + 0x40);
  uVar2 = VP8BitWriterPos(bw_00);
  iVar1 = VP8BitWriterInit(in_stack_ffffffffffffffc0,
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    local_4 = WebPEncodingSetError(*(WebPPicture **)(in_RDI + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    VP8PutBitUniform(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    VP8PutBitUniform(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    PutSegmentHeader(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    PutFilterHeader(in_stack_ffffffffffffffc0,
                    (VP8EncFilterHeader *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (*(int *)(in_RDI + 0x3c) == 8) {
      value = 3;
    }
    else if (*(int *)(in_RDI + 0x3c) == 4) {
      in_stack_ffffffffffffffb8 = 2;
      value = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffb8 = (uint)(*(int *)(in_RDI + 0x3c) == 2);
      value = in_stack_ffffffffffffffb8;
    }
    bw_01 = bw_00;
    VP8PutBits(bw_00,value,in_stack_ffffffffffffffb8);
    PutQuant(bw_01,(VP8Encoder *)CONCAT44(value,in_stack_ffffffffffffffb8));
    VP8PutBitUniform(bw_01,value);
    VP8WriteProbas(in_stack_ffffffffffffffd0,(VP8EncProba *)in_stack_ffffffffffffffc8);
    uVar3 = VP8BitWriterPos(bw_00);
    VP8CodeIntraModes(in_stack_00000f00);
    VP8BitWriterFinish((VP8BitWriter *)0x1abe1b);
    uVar4 = VP8BitWriterPos(bw_00);
    if (*(long *)(*(long *)(in_RDI + 8) + 0x80) != 0) {
      *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x80) + 0x24) = (int)((uVar3 - uVar2) + 7 >> 3);
      *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x80) + 0x28) = (int)((uVar4 - uVar3) + 7 >> 3);
      *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0x80) + 0x8c) =
           *(undefined4 *)(in_RDI + 0x228);
    }
    if (*(int *)(in_RDI + 0x68) == 0) {
      local_4 = 1;
    }
    else {
      local_4 = WebPEncodingSetError(*(WebPPicture **)(in_RDI + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
  }
  return local_4;
}

Assistant:

static int GeneratePartition0(VP8Encoder* const enc) {
  VP8BitWriter* const bw = &enc->bw_;
  const int mb_size = enc->mb_w_ * enc->mb_h_;
  uint64_t pos1, pos2, pos3;

  pos1 = VP8BitWriterPos(bw);
  if (!VP8BitWriterInit(bw, mb_size * 7 / 8)) {        // ~7 bits per macroblock
    return WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8PutBitUniform(bw, 0);   // colorspace
  VP8PutBitUniform(bw, 0);   // clamp type

  PutSegmentHeader(bw, enc);
  PutFilterHeader(bw, &enc->filter_hdr_);
  VP8PutBits(bw, enc->num_parts_ == 8 ? 3 :
                 enc->num_parts_ == 4 ? 2 :
                 enc->num_parts_ == 2 ? 1 : 0, 2);
  PutQuant(bw, enc);
  VP8PutBitUniform(bw, 0);   // no proba update
  VP8WriteProbas(bw, &enc->proba_);
  pos2 = VP8BitWriterPos(bw);
  VP8CodeIntraModes(enc);
  VP8BitWriterFinish(bw);

  pos3 = VP8BitWriterPos(bw);

#if !defined(WEBP_DISABLE_STATS)
  if (enc->pic_->stats) {
    enc->pic_->stats->header_bytes[0] = (int)((pos2 - pos1 + 7) >> 3);
    enc->pic_->stats->header_bytes[1] = (int)((pos3 - pos2 + 7) >> 3);
    enc->pic_->stats->alpha_data_size = (int)enc->alpha_data_size_;
  }
#else
  (void)pos1;
  (void)pos2;
  (void)pos3;
#endif
  if (bw->error_) {
    return WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return 1;
}